

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O3

char * env_get(char *s)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char *s_00;
  long lVar4;
  
  if (s != (char *)0x0) {
    uVar2 = str_len(s);
    s_00 = (char *)*_environ;
    if (s_00 != (char *)0x0) {
      lVar4 = 8;
      while ((iVar3 = str_start(s_00,s), iVar3 == 0 ||
             (lVar1 = *(long *)((long)_environ + lVar4 + -8), *(char *)(lVar1 + (ulong)uVar2) != '='
             ))) {
        s_00 = *(char **)((long)_environ + lVar4);
        lVar4 = lVar4 + 8;
        if (s_00 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      return (char *)(lVar1 + (ulong)uVar2 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

extern /*@null@*/char *env_get(const char *s)
{
  int i;
  unsigned int len;

  if (!s) return 0;
  len = str_len(s);
  for (i = 0;environ[i];++i)
    if (str_start(environ[i],s) && (environ[i][len] == '='))
      return environ[i] + len + 1;
  return 0;
}